

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

errr finish_parse_p_race(parser *p)

{
  player_race *ppVar1;
  player_race *ppVar2;
  uint uVar3;
  
  ppVar1 = (player_race *)parser_priv(p);
  uVar3 = 0;
  for (ppVar2 = ppVar1; races = ppVar1, ppVar2 != (player_race *)0x0; ppVar2 = ppVar2->next) {
    uVar3 = uVar3 + 1;
  }
  while( true ) {
    if (ppVar1 == (player_race *)0x0) {
      parser_destroy(p);
      return 0;
    }
    uVar3 = uVar3 - 1;
    if (uVar3 == 0xffffffff) break;
    ppVar1->ridx = uVar3;
    ppVar1 = ppVar1->next;
  }
  __assert_fail("num",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c",
                0xb0b,"errr finish_parse_p_race(struct parser *)");
}

Assistant:

static errr finish_parse_p_race(struct parser *p) {
	struct player_race *r;
	int num = 0;
	races = parser_priv(p);
	for (r = races; r; r = r->next) num++;
	for (r = races; r; r = r->next, num--) {
		assert(num);
		r->ridx = num - 1;
	}
	parser_destroy(p);
	return 0;
}